

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

Vector<double,_3U> * __thiscall
OpenMD::mCross<double,3u,3u>
          (Vector<double,_3U> *__return_storage_ptr__,OpenMD *this,RectMatrix<double,_3U,_3U> *t1,
          RectMatrix<double,_3U,_3U> *t2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  uVar2 = 0;
  while (uVar2 != 3) {
    uVar1 = uVar2 + 1;
    uVar3 = uVar1 & 0xffffffff;
    if (uVar1 == 3) {
      uVar3 = 0;
    }
    uVar4 = (ulong)((int)uVar2 - 1);
    if (uVar2 == 0) {
      uVar4 = 2;
    }
    dVar6 = __return_storage_ptr__->data_[uVar2];
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      dVar6 = dVar6 + (*(double *)(this + lVar5 * 8 + uVar3 * 0x18) * t1->data_[uVar4][lVar5] -
                      t1->data_[uVar3][lVar5] * *(double *)(this + lVar5 * 8 + uVar4 * 0x18));
    }
    __return_storage_ptr__->data_[uVar2] = dVar6;
    uVar2 = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<Real, Row> mCross(const RectMatrix<Real, Row, Col>& t1,
                                  const RectMatrix<Real, Row, Col>& t2) {
    Vector<Real, Row> result;
    unsigned int i1;
    unsigned int i2;

    for (unsigned int i = 0; i < Row; i++) {
      i1 = (i + 1) % Row;
      i2 = (i + 2) % Row;
      for (unsigned int j = 0; j < Col; j++) {
        result[i] += t1(i1, j) * t2(i2, j) - t1(i2, j) * t2(i1, j);
      }
    }
    return result;
  }